

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::Interpreter::Init
          (Error *__return_storage_ptr__,Interpreter *this,string *aConfigFile,string *aRegistryFile
          )

{
  bool bVar1;
  Status SVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  Error *pEVar6;
  JobManager *this_00;
  element_type *this_01;
  Registry *this_02;
  element_type *this_03;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar7;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  bool local_692;
  char *local_5c8;
  Error local_5a8;
  anon_class_1_0_00000001 local_57a;
  v10 local_579;
  v10 *local_578;
  size_t local_570;
  string local_568;
  Error local_548;
  anon_class_1_0_00000001 local_51a;
  v10 local_519;
  v10 *local_518;
  size_t local_510;
  string local_508;
  Error local_4e8;
  anon_class_1_0_00000001 local_4ba;
  v10 local_4b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b8;
  char *local_4b0;
  string local_4a8;
  Error local_488;
  ErrorCode local_45c;
  Error local_458;
  uint local_42c;
  undefined1 local_428 [4];
  int flags;
  value_type_conflict1 local_415;
  ErrorCode local_414;
  Error local_410;
  ErrorCode local_3e4;
  Error local_3e0;
  undefined1 local_3b8 [8];
  Config config;
  string configJson;
  allocator local_281;
  string local_280;
  undefined1 local_260 [8];
  string verboseEnv;
  string *aRegistryFile_local;
  string *aConfigFile_local;
  Interpreter *this_local;
  Error *error;
  undefined1 local_200 [16];
  v10 *local_1f0;
  ulong local_1e8;
  v10 *local_1e0;
  size_t sStack_1d8;
  string *local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1c8 [3];
  undefined1 local_1b0 [16];
  v10 *local_1a0;
  ulong local_198;
  v10 *local_190;
  size_t sStack_188;
  string *local_180;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_178 [3];
  undefined1 local_160 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  char *local_148;
  string *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  char *pcStack_130;
  string *local_128;
  v10 *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_118;
  v10 *local_110;
  v10 **local_108;
  v10 *local_100;
  v10 **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  size_t sStack_e0;
  v10 **local_d0;
  v10 *local_c8;
  size_t sStack_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b0;
  undefined1 *local_a8;
  Error **local_a0;
  undefined1 *local_98;
  Error **local_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_88;
  Error **local_80;
  undefined8 local_78;
  undefined1 *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  
  verboseEnv.field_2._M_local_buf[0xf] = '\0';
  Error::Error(__return_storage_ptr__);
  pcVar4 = getenv("VERBOSE");
  if (pcVar4 == (char *)0x0) {
    local_5c8 = "";
  }
  else {
    local_5c8 = getenv("VERBOSE");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,local_5c8,&local_281);
  ToLower((string *)local_260,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::__cxx11::string::string((string *)(config.mThreadSMRoot.field_2._M_local_buf + 8));
  Config::Config((Config *)local_3b8);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    ReadFile(&local_3e0,(string *)((long)&config.mThreadSMRoot.field_2 + 8),aConfigFile);
    pEVar6 = Error::operator=(__return_storage_ptr__,&local_3e0);
    local_3e4 = kNone;
    bVar1 = commissioner::operator!=(pEVar6,&local_3e4);
    Error::~Error(&local_3e0);
    if (bVar1) goto LAB_00321f33;
    ConfigFromJson(&local_410,(Config *)local_3b8,
                   (string *)((long)&config.mThreadSMRoot.field_2 + 8));
    pEVar6 = Error::operator=(__return_storage_ptr__,&local_410);
    local_414 = kNone;
    bVar1 = commissioner::operator!=(pEVar6,&local_414);
    Error::~Error(&local_410);
    if (bVar1) goto LAB_00321f33;
  }
  else {
    local_3b8[0] = false;
    local_415 = 0xff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&config.mId.field_2 + 8),0x10,&local_415);
    SysLogger::Create((SysLogger *)local_428,kDebug);
    std::shared_ptr<ot::commissioner::Logger>::operator=
              ((shared_ptr<ot::commissioner::Logger> *)&config.mMaxConnectionNum,
               (shared_ptr<ot::commissioner::SysLogger> *)local_428);
    std::shared_ptr<ot::commissioner::SysLogger>::~shared_ptr
              ((shared_ptr<ot::commissioner::SysLogger> *)local_428);
  }
  std::atomic<bool>::operator=(&this->mCancelCommand,false);
  this_00 = (JobManager *)operator_new(0x180);
  JobManager::JobManager(this_00,this);
  std::__shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>::
  reset<ot::commissioner::JobManager>
            (&(this->mJobManager).
              super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>,this_00);
  this_01 = std::
            __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mJobManager);
  JobManager::Init(&local_458,this_01,(Config *)local_3b8);
  pEVar6 = Error::operator=(__return_storage_ptr__,&local_458);
  local_45c = kNone;
  bVar1 = commissioner::operator!=(pEVar6,&local_45c);
  Error::~Error(&local_458);
  if (!bVar1) {
    this_02 = (Registry *)operator_new(0x10);
    persistent_storage::Registry::Registry(this_02,aRegistryFile);
    std::__shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>::
    reset<ot::commissioner::persistent_storage::Registry>
              (&(this->mRegistry).
                super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
               ,this_02);
    bVar1 = std::operator!=(&this->mRegistry,(nullptr_t)0x0);
    if (bVar1) {
      this_03 = std::
                __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->mRegistry);
      SVar2 = persistent_storage::Registry::Open(this_03);
      if (SVar2 == kSuccess) {
        iVar3 = pipe(this->mCancelPipe);
        if (iVar3 == -1) {
          Init::anon_class_1_0_00000001::operator()(&local_57a);
          local_f8 = &local_578;
          local_100 = &local_579;
          bVar7 = ::fmt::v10::operator()(local_100);
          local_570 = bVar7.size_;
          local_578 = (v10 *)bVar7.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_1d0 = &local_568;
          local_1e0 = local_578;
          sStack_1d8 = local_570;
          local_d0 = &local_1e0;
          local_1f0 = local_578;
          local_1e8 = local_570;
          local_c8 = local_1f0;
          sStack_c0 = local_1e8;
          error = (Error *)::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
          local_98 = local_200;
          local_a0 = &error;
          local_78 = 0;
          fmt_01.size_ = 0;
          fmt_01.data_ = (char *)local_1e8;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)local_a0;
          local_90 = local_a0;
          local_80 = local_a0;
          local_70 = local_98;
          ::fmt::v10::vformat_abi_cxx11_(&local_568,local_1f0,fmt_01,args_01);
          Error::Error(&local_548,kIOError,&local_568);
          Error::operator=(__return_storage_ptr__,&local_548);
          Error::~Error(&local_548);
          std::__cxx11::string::~string((string *)&local_568);
        }
        else {
          local_42c = fcntl(this->mCancelPipe[0],3,0);
          fcntl(this->mCancelPipe[0],4,(ulong)(local_42c | 0x800));
          local_42c = fcntl(this->mCancelPipe[1],3,0);
          fcntl(this->mCancelPipe[1],4,(ulong)(local_42c | 0x800));
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_260,"1");
          local_692 = true;
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_260,"yes");
            local_692 = true;
            if (!bVar1) {
              local_692 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_260,"true");
            }
          }
          gVerbose = local_692;
          UpdateNetworkSelectionInfo(&local_5a8,this,true);
          Error::operator=(__return_storage_ptr__,&local_5a8);
          Error::~Error(&local_5a8);
        }
      }
      else {
        Init::anon_class_1_0_00000001::operator()(&local_51a);
        local_108 = &local_518;
        local_110 = &local_519;
        bVar7 = ::fmt::v10::operator()(local_110);
        local_510 = bVar7.size_;
        local_518 = (v10 *)bVar7.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_180 = &local_508;
        local_190 = local_518;
        sStack_188 = local_510;
        local_f0 = &local_190;
        local_1a0 = local_518;
        local_198 = local_510;
        local_e8 = local_1a0;
        sStack_e0 = local_198;
        local_1c8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_a8 = local_1b0;
        local_b0 = local_1c8;
        local_60 = 0;
        fmt_00.size_ = 0;
        fmt_00.data_ = (char *)local_198;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_b0;
        local_88 = local_b0;
        local_68 = local_b0;
        local_58 = local_a8;
        ::fmt::v10::vformat_abi_cxx11_(&local_508,local_1a0,fmt_00,args_00);
        Error::Error(&local_4e8,kRegistryError,&local_508);
        Error::operator=(__return_storage_ptr__,&local_4e8);
        Error::~Error(&local_4e8);
        std::__cxx11::string::~string((string *)&local_508);
      }
    }
    else {
      Init::anon_class_1_0_00000001::operator()(&local_4ba);
      local_118 = &local_4b8;
      local_120 = &local_4b9;
      bVar7 = ::fmt::v10::operator()(local_120);
      local_4b0 = (char *)bVar7.size_;
      local_4b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar7.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      local_128 = &local_4a8;
      local_138 = local_4b8;
      pcStack_130 = local_4b0;
      local_50 = &local_138;
      local_150 = local_4b8;
      local_148 = local_4b0;
      local_140 = aRegistryFile;
      local_48 = local_150;
      pcStack_40 = local_148;
      local_178[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)aRegistryFile,(v10 *)local_128,local_4b8);
      local_30 = local_160;
      local_38 = local_178;
      local_20 = 0xd;
      fmt.size_ = 0xd;
      fmt.data_ = local_148;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_38;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(&local_4a8,(v10 *)local_150,fmt,args);
      Error::Error(&local_488,kOutOfMemory,&local_4a8);
      Error::operator=(__return_storage_ptr__,&local_488);
      Error::~Error(&local_488);
      std::__cxx11::string::~string((string *)&local_4a8);
    }
  }
LAB_00321f33:
  verboseEnv.field_2._M_local_buf[0xf] = '\x01';
  Config::~Config((Config *)local_3b8);
  std::__cxx11::string::~string((string *)(config.mThreadSMRoot.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_260);
  if ((verboseEnv.field_2._M_local_buf[0xf] & 1U) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Interpreter::Init(const std::string &aConfigFile, const std::string &aRegistryFile)
{
    Error error;

    std::string verboseEnv = ToLower(SafeStr(getenv("VERBOSE")));
    std::string configJson;
    Config      config;

    if (!aConfigFile.empty())
    {
        SuccessOrExit(error = ReadFile(configJson, aConfigFile));
        SuccessOrExit(error = ConfigFromJson(config, configJson));
    }
    else
    {
        // Default to Non-CCM mode if no configuration file is provided.
        config.mEnableCcm = false;
        config.mPSKc.assign(kMaxPSKcLength, 0xff);
        config.mLogger = SysLogger::Create(LogLevel::kDebug);
    }

    int flags;

    mCancelCommand = false;

    mJobManager.reset(new JobManager(*this));
    SuccessOrExit(error = mJobManager->Init(config));
    mRegistry.reset(new Registry(aRegistryFile));
    VerifyOrExit(mRegistry != nullptr,
                 error = ERROR_OUT_OF_MEMORY("Failed to create registry for file '{}'", aRegistryFile));
    VerifyOrExit(mRegistry->Open() == RegistryStatus::kSuccess,
                 error = ERROR_REGISTRY_ERROR("registry failed to open"));

    VerifyOrExit(pipe(mCancelPipe) != -1,
                 error = ERROR_IO_ERROR("failed to initialize command cancellation structures"));
    // set both pipe FDs non-blocking
    flags = fcntl(mCancelPipe[0], F_GETFL, 0);
    fcntl(mCancelPipe[0], F_SETFL, flags | O_NONBLOCK);
    flags = fcntl(mCancelPipe[1], F_GETFL, 0);
    fcntl(mCancelPipe[1], F_SETFL, flags | O_NONBLOCK);
    // set up console verbosity
    gVerbose = verboseEnv == "1" || verboseEnv == "yes" || verboseEnv == "true";
    error    = UpdateNetworkSelectionInfo(true);
exit:
    return error;
}